

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_MultipleFilesServiceEdition2023_Test::TestBody
          (NameResolverTest_MultipleFilesServiceEdition2023_Test *this)

{
  undefined1 *puVar1;
  long *plVar2;
  ServiceDescriptor *descriptor;
  char *pcVar3;
  string_view filename;
  string_view name;
  string_view contents;
  AssertionResult gtest_ar;
  ClassNameResolver resolver;
  AssertHelper local_f0;
  internal local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  undefined1 local_d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined2 local_90;
  ClassNameResolver local_88;
  
  filename._M_str = "foo.proto";
  filename._M_len = 9;
  contents._M_str =
       "\n      edition = \"2023\";\n\n      option java_generic_services = true;\n      option java_multiple_files = true;\n\n      package proto2_unittest;\n\n      message Dummy {}\n      service FooService {\n        rpc FooMethod(Dummy) returns (Dummy) {}\n      }\n                "
  ;
  contents._M_len = 0x109;
  NameResolverTest::BuildFileAndPopulatePool(&this->super_NameResolverTest,filename,contents);
  name._M_str = "proto2_unittest.FooService";
  name._M_len = 0x1a;
  descriptor = DescriptorPool::FindServiceByName(&(this->super_NameResolverTest).pool_,name);
  local_d8[0] = false;
  local_d8[1] = false;
  local_d8[2] = false;
  local_d8[3] = false;
  local_d8[4] = true;
  local_d8[5] = false;
  local_d8._16_8_ = 0;
  local_c0._M_local_buf[0] = '\0';
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90._0_1_ = false;
  local_90._1_1_ = true;
  local_d8._8_8_ = &local_c0;
  local_b0._M_p = (pointer)&local_a0;
  ClassNameResolver::ClassNameResolver(&local_88,(Options *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,
                    CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._8_8_ != &local_c0) {
    operator_delete((void *)local_d8._8_8_,
                    CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_d8,&local_88,descriptor,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[27]>
            (local_e8,"resolver.GetClassName(service_descriptor, true)",
             "\"\" \"proto2_unittest.FooService\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [27])"proto2_unittest.FooService");
  puVar1 = (undefined1 *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
  if (puVar1 != local_d8 + 0x10) {
    operator_delete(puVar1,local_d8._16_8_ + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xa4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar2 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_((string *)local_d8,&local_88,descriptor);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[27]>
            (local_e8,"resolver.GetJavaImmutableClassName(service_descriptor)",
             "\"\" \"proto2_unittest.FooService\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [27])"proto2_unittest.FooService");
  puVar1 = (undefined1 *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
  if (puVar1 != local_d8 + 0x10) {
    operator_delete(puVar1,local_d8._16_8_ + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xa6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar2 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  ClassNameResolver::~ClassNameResolver(&local_88);
  return;
}

Assistant:

TEST_F(NameResolverTest, MultipleFilesServiceEdition2023) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2023";

      option java_generic_services = true;
      option java_multiple_files = true;

      package proto2_unittest;

      message Dummy {}
      service FooService {
        rpc FooMethod(Dummy) returns (Dummy) {}
      }
                )schema");

  auto service_descriptor =
      pool_.FindServiceByName("proto2_unittest.FooService");
  ClassNameResolver resolver;
  EXPECT_EQ(resolver.GetClassName(service_descriptor, /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooService");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(service_descriptor),
            PACKAGE_PREFIX "proto2_unittest.FooService");
}